

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write_char<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,char value,
          basic_format_specs<char> *specs)

{
  size_t sVar1;
  long lVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  ulong uVar4;
  ulong n;
  
  lVar2 = (long)specs->width;
  if (-1 < lVar2) {
    uVar4 = 0;
    if (lVar2 != 0) {
      uVar4 = lVar2 - 1;
    }
    n = uVar4 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                           (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar3 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>(out,n,&specs->fill);
    if ((bVar3.container)->capacity_ < (bVar3.container)->size_ + 1) {
      (**(bVar3.container)->_vptr_buffer)(bVar3.container);
    }
    sVar1 = (bVar3.container)->size_;
    (bVar3.container)->size_ = sVar1 + 1;
    (bVar3.container)->ptr_[sVar1] = value;
    bVar3 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (bVar3,uVar4 - n,&specs->fill);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar3.container;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

inline OutputIt write_padded(OutputIt out,
                             const basic_format_specs<Char>& specs, size_t size,
                             size_t width, F&& f) {
  static_assert(align == align::left || align == align::right, "");
  unsigned spec_width = to_unsigned(specs.width);
  size_t padding = spec_width > width ? spec_width - width : 0;
  auto* shifts = align == align::left ? data::left_padding_shifts
                                      : data::right_padding_shifts;
  size_t left_padding = padding >> shifts[specs.align];
  auto it = reserve(out, size + padding * specs.fill.size());
  it = fill(it, left_padding, specs.fill);
  it = f(it);
  it = fill(it, padding - left_padding, specs.fill);
  return base_iterator(out, it);
}